

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void test_get_regex_literal(wstring_view text)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  undefined8 uVar1;
  bool bVar2;
  version v;
  wostream *pwVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  undefined1 local_48 [8];
  wstring _r;
  wstring_view _l;
  wstring_view text_local;
  
  _r.field_2._8_8_ = text._M_len;
  get_one_regexp_literal_abi_cxx11_((wstring *)local_48,text);
  uVar1 = _r.field_2._8_8_;
  __y = (__type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_>)
        std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_48);
  __x._M_str = text._M_str;
  __x._M_len = uVar1;
  bVar2 = std::operator!=(__x,__y);
  if (!bVar2) {
    std::__cxx11::wstring::~wstring((wstring *)local_48);
    return;
  }
  pwVar3 = std::operator<<((wostream *)&std::wcerr,"test_get_regex_literal");
  pwVar3 = std::operator<<(pwVar3," in ");
  pwVar3 = std::operator<<(pwVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar3 = std::operator<<(pwVar3,":");
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,0x8f);
  pwVar3 = std::operator<<(pwVar3,":\n");
  pwVar3 = std::operator<<(pwVar3,"text");
  pwVar3 = std::operator<<(pwVar3," != ");
  pwVar3 = std::operator<<(pwVar3,"get_one_regexp_literal(text)");
  pwVar3 = std::operator<<(pwVar3,"\n");
  __str._M_str = text._M_str;
  __str._M_len = _r.field_2._8_8_;
  pbVar4 = std::operator<<(pwVar3,__str);
  pwVar3 = std::operator<<(pbVar4," != ");
  pwVar3 = std::operator<<(pwVar3,(wstring *)local_48);
  pwVar3 = std::operator<<(pwVar3,"\n");
  v = tested_version();
  pbVar4 = mjs::operator<<(pwVar3,v);
  std::operator<<(pbVar4,"\n");
  abort();
}

Assistant:

void test_get_regex_literal(std::wstring_view text) {
    REQUIRE_EQ(text, get_one_regexp_literal(text));
}